

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Element __thiscall ftxui::xframe(ftxui *this,Element *child)

{
  shared_ptr<ftxui::Node> *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  bool local_5d [13];
  shared_ptr<ftxui::Node> local_50;
  Elements local_40;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_28;
  Element *child_local;
  
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = child;
  child_local = (Element *)this;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_50,child);
  unpack<std::shared_ptr<ftxui::Node>>(&local_40,(ftxui *)&local_50,args);
  local_5d[0] = true;
  std::
  make_shared<ftxui::Frame,std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>,bool,bool>
            (&local_28,(bool *)&local_40,local_5d);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::Frame,void>
            ((shared_ptr<ftxui::Node> *)this,(shared_ptr<ftxui::Frame> *)&local_28);
  std::shared_ptr<ftxui::Frame>::~shared_ptr((shared_ptr<ftxui::Frame> *)&local_28);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_50);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element xframe(Element child) {
  return std::make_shared<Frame>(unpack(std::move(child)), true, false);
}